

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O0

void __thiscall MkvInterface::~MkvInterface(MkvInterface *this)

{
  EbmlStream *this_00;
  size_type sVar1;
  reference ppuVar2;
  int in_ESI;
  ulong local_18;
  size_t i;
  MkvInterface *this_local;
  
  if (this->m_file != (StdIOCallback *)0x0) {
    close(this,in_ESI);
  }
  if ((this->aStream != (EbmlStream *)0x0) &&
     (this_00 = this->aStream, this_00 != (EbmlStream *)0x0)) {
    libebml::EbmlStream::~EbmlStream(this_00);
    operator_delete(this_00,8);
  }
  this->aStream = (EbmlStream *)0x0;
  for (local_18 = 0;
      sVar1 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                        (&this->m_attachmentBuffer), local_18 < sVar1; local_18 = local_18 + 1) {
    ppuVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::at
                        (&this->m_attachmentBuffer,local_18);
    if (*ppuVar2 != (value_type)0x0) {
      operator_delete__(*ppuVar2);
    }
  }
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear(&this->m_attachmentBuffer);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_keyPositions);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_timeStamps);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_attachmentSize);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_attachmentID);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(&this->m_attachmentBuffer)
  ;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(&this->m_frameBuffer);
  libmatroska::KaxSegment::~KaxSegment(&this->m_fileSegment);
  return;
}

Assistant:

MkvInterface::~MkvInterface()
{
    if (m_file != NULL)
        close();
    
    if (aStream != NULL)
        delete aStream;
    aStream = NULL;
    
    for (size_t i=0; i<m_attachmentBuffer.size(); i++)
        delete[] m_attachmentBuffer.at(i);
    m_attachmentBuffer.clear();
}